

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_168::EarlyCastFinder::flushRefAsResult
          (EarlyCastFinder *this,size_t index,Module *module)

{
  mapped_type pRVar1;
  RefAs *pRVar2;
  RefAs *pRVar3;
  Expression **ppEVar4;
  mapped_type *ppRVar5;
  pointer pRVar6;
  RefAs *local_40;
  EarlyCastFinder *local_38;
  
  pRVar6 = (this->currRefAsMove).
           super__Vector_base<wasm::(anonymous_namespace)::RefAsInfo,_std::allocator<wasm::(anonymous_namespace)::RefAsInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar6[index].target != (LocalGet *)0x0) {
    pRVar6 = pRVar6 + index;
    if (pRVar6->bestCast != (RefAs *)0x0) {
      pRVar2 = pRVar6->bestCast;
      local_38 = this;
      do {
        pRVar3 = pRVar2;
        local_40 = pRVar3;
        ppEVar4 = Properties::getImmediateFallthroughPtr
                            ((Expression **)&local_40,&this->options,module,AllowTeeBrIf);
        pRVar2 = (RefAs *)*ppEVar4;
      } while ((RefAs *)*ppEVar4 != pRVar3);
      if (pRVar3 != (RefAs *)pRVar6->target) {
        pRVar1 = pRVar6->bestCast;
        ppRVar5 = std::__detail::
                  _Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::RefAs_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::RefAs_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::LocalGet_*,_std::pair<wasm::LocalGet_*const,_wasm::RefAs_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::RefAs_*>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_38->refAsToApply,&pRVar6->target);
        *ppRVar5 = pRVar1;
      }
      pRVar6->bestCast = (RefAs *)0x0;
    }
    pRVar6->target = (key_type)0x0;
  }
  return;
}

Assistant:

void flushRefAsResult(size_t index, Module& module) {
    auto& target = currRefAsMove[index].target;
    if (target) {
      auto& bestCast = currRefAsMove[index].bestCast;
      if (bestCast) {
        // As in flushRefCastResult, we need to check if the cast is already at
        // the target and thus does not need to be moved.
        auto* fallthrough =
          Properties::getFallthrough(bestCast, options, module);
        if (fallthrough != target) {
          refAsToApply[target] = bestCast;
        }
        bestCast = nullptr;
      }
      target = nullptr;
    }
  }